

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::HttpByteRange> *
kj::anon_unknown_36::consumeIntRange
          (Maybe<kj::HttpByteRange> *__return_storage_ptr__,char **ptr,uint64_t contentLength)

{
  NullableValue<unsigned_int> *other;
  uint *puVar1;
  uint *puVar2;
  char *pcVar3;
  HttpByteRange local_a8;
  HttpByteRange local_98;
  uint *local_80;
  uint *lastPos;
  uint *_lastPos1185;
  Maybe<unsigned_int> maybeLastPos;
  uint *n;
  undefined1 local_3c [8];
  NullableValue<unsigned_int> local_34;
  NullableValue<unsigned_int> _n1174;
  uint firstPos;
  char *p;
  uint64_t contentLength_local;
  char **ptr_local;
  
  unique0x00012000 = *ptr;
  register0x00000000 = skipSpace(unique0x00012000);
  consumeNumber((kj *)local_3c,(char **)&_n1174.field_1);
  other = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)local_3c);
  kj::_::NullableValue<unsigned_int>::NullableValue
            ((NullableValue<unsigned_int> *)(local_3c + 8),other);
  Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)local_3c);
  puVar1 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)(local_3c + 8));
  if (puVar1 == (uint *)0x0) {
    Maybe<kj::HttpByteRange>::Maybe(__return_storage_ptr__);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_int>::operator*
                       ((NullableValue<unsigned_int> *)(local_3c + 8));
    _n1174._0_4_ = *puVar2;
  }
  maybeLastPos.ptr.field_1.value._1_3_ = 0;
  maybeLastPos.ptr.field_1.value._0_1_ = puVar1 == (uint *)0x0;
  kj::_::NullableValue<unsigned_int>::~NullableValue((NullableValue<unsigned_int> *)(local_3c + 8));
  if (maybeLastPos.ptr.field_1.value == 0) {
    pcVar3 = skipSpace(stack0xffffffffffffffd8);
    register0x00000008 = pcVar3 + 1;
    if (*pcVar3 == '-') {
      register0x00000000 = skipSpace(register0x00000008);
      consumeNumber((kj *)((long)&_lastPos1185 + 4),(char **)&_n1174.field_1);
      register0x00000000 = skipSpace(stack0xffffffffffffffd8);
      lastPos = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)((long)&_lastPos1185 + 4));
      if (lastPos == (uint *)0x0) {
        *ptr = stack0xffffffffffffffd8;
        local_a8.start = (uint64_t)(uint)_n1174._0_4_;
        local_a8.end = contentLength - 1;
        Maybe<kj::HttpByteRange>::Maybe(__return_storage_ptr__,&local_a8);
      }
      else {
        local_80 = lastPos;
        if (*lastPos < (uint)_n1174._0_4_) {
          Maybe<kj::HttpByteRange>::Maybe(__return_storage_ptr__);
        }
        else {
          if (contentLength <= *lastPos) {
            *lastPos = (int)contentLength - 1;
          }
          *ptr = stack0xffffffffffffffd8;
          local_98.start = (uint64_t)(uint)_n1174._0_4_;
          local_98.end = (uint64_t)*lastPos;
          Maybe<kj::HttpByteRange>::Maybe(__return_storage_ptr__,&local_98);
        }
      }
      maybeLastPos.ptr.field_1.value = 1;
      Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)((long)&_lastPos1185 + 4));
    }
    else {
      Maybe<kj::HttpByteRange>::Maybe(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static kj::Maybe<HttpByteRange> consumeIntRange(const char*& ptr, uint64_t contentLength) {
  const char* p = ptr;
  p = skipSpace(p);
  uint firstPos;
  KJ_IF_SOME(n, consumeNumber(p)) {
    firstPos = n;
  } else {
    return kj::none;
  }